

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

void PredictorAdd10_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  undefined1 auVar10 [16];
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined4 uVar48;
  undefined8 uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  char cVar37;
  undefined8 uVar38;
  char cVar42;
  char cVar43;
  char cVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined4 uVar49;
  undefined1 auVar41 [16];
  
  auVar6 = _DAT_00146e50;
  auVar35 = ZEXT416(out[-1]);
  lVar7 = 0;
  lVar8 = 0;
  while (lVar8 + 4 <= (long)num_pixels) {
    pcVar1 = (char *)((long)in + lVar7);
    cVar37 = pcVar1[8];
    cVar42 = pcVar1[9];
    cVar43 = pcVar1[10];
    cVar44 = pcVar1[0xb];
    cVar2 = pcVar1[0xc];
    cVar3 = pcVar1[0xd];
    cVar4 = pcVar1[0xe];
    cVar5 = pcVar1[0xf];
    auVar45 = *(undefined1 (*) [16])((long)upper + lVar7 + -4);
    auVar10 = *(undefined1 (*) [16])((long)upper + lVar7);
    auVar39 = *(undefined1 (*) [16])((long)upper + lVar7 + 4);
    cVar9 = pavgb(auVar10[0],auVar39[0]);
    cVar11 = pavgb(auVar10[1],auVar39[1]);
    cVar12 = pavgb(auVar10[2],auVar39[2]);
    cVar13 = pavgb(auVar10[3],auVar39[3]);
    cVar14 = pavgb(auVar10[4],auVar39[4]);
    cVar15 = pavgb(auVar10[5],auVar39[5]);
    cVar16 = pavgb(auVar10[6],auVar39[6]);
    cVar17 = pavgb(auVar10[7],auVar39[7]);
    cVar18 = pavgb(auVar10[8],auVar39[8]);
    cVar19 = pavgb(auVar10[9],auVar39[9]);
    cVar20 = pavgb(auVar10[10],auVar39[10]);
    cVar21 = pavgb(auVar10[0xb],auVar39[0xb]);
    cVar22 = pavgb(auVar10[0xc],auVar39[0xc]);
    cVar23 = pavgb(auVar10[0xd],auVar39[0xd]);
    cVar24 = pavgb(auVar10[0xe],auVar39[0xe]);
    cVar25 = pavgb(auVar10[0xf],auVar39[0xf]);
    auVar39 = (auVar39 ^ auVar10) & auVar6;
    auVar10[0] = cVar9 - auVar39[0];
    auVar10[1] = cVar11 - auVar39[1];
    auVar10[2] = cVar12 - auVar39[2];
    auVar10[3] = cVar13 - auVar39[3];
    auVar10[4] = cVar14 - auVar39[4];
    auVar10[5] = cVar15 - auVar39[5];
    auVar10[6] = cVar16 - auVar39[6];
    auVar10[7] = cVar17 - auVar39[7];
    auVar10[8] = cVar18 - auVar39[8];
    auVar10[9] = cVar19 - auVar39[9];
    auVar10[10] = cVar20 - auVar39[10];
    auVar10[0xb] = cVar21 - auVar39[0xb];
    auVar10[0xc] = cVar22 - auVar39[0xc];
    auVar10[0xd] = cVar23 - auVar39[0xd];
    auVar10[0xe] = cVar24 - auVar39[0xe];
    auVar10[0xf] = cVar25 - auVar39[0xf];
    cVar9 = pavgb(auVar35[0],auVar45[0]);
    cVar11 = pavgb(auVar35[1],auVar45[1]);
    cVar12 = pavgb(auVar35[2],auVar45[2]);
    cVar13 = pavgb(auVar35[3],auVar45[3]);
    cVar14 = pavgb(auVar35[4],auVar45[4]);
    cVar15 = pavgb(auVar35[5],auVar45[5]);
    cVar16 = pavgb(auVar35[6],auVar45[6]);
    cVar17 = pavgb(auVar35[7],auVar45[7]);
    uVar26 = auVar45[8];
    cVar18 = pavgb(auVar35[8],uVar26);
    uVar27 = auVar45[9];
    cVar19 = pavgb(auVar35[9],uVar27);
    uVar28 = auVar45[10];
    cVar20 = pavgb(auVar35[10],uVar28);
    uVar29 = auVar45[0xb];
    cVar21 = pavgb(auVar35[0xb],uVar29);
    uVar30 = auVar45[0xc];
    cVar22 = pavgb(auVar35[0xc],uVar30);
    uVar31 = auVar45[0xd];
    cVar23 = pavgb(auVar35[0xd],uVar31);
    uVar32 = auVar45[0xe];
    cVar24 = pavgb(auVar35[0xe],uVar32);
    uVar33 = auVar45[0xf];
    cVar25 = pavgb(auVar35[0xf],uVar33);
    auVar35 = (auVar45 ^ auVar35) & auVar6;
    auVar36[0] = cVar9 - auVar35[0];
    auVar36[1] = cVar11 - auVar35[1];
    auVar36[2] = cVar12 - auVar35[2];
    auVar36[3] = cVar13 - auVar35[3];
    auVar36[4] = cVar14 - auVar35[4];
    auVar36[5] = cVar15 - auVar35[5];
    auVar36[6] = cVar16 - auVar35[6];
    auVar36[7] = cVar17 - auVar35[7];
    auVar36[8] = cVar18 - auVar35[8];
    auVar36[9] = cVar19 - auVar35[9];
    auVar36[10] = cVar20 - auVar35[10];
    auVar36[0xb] = cVar21 - auVar35[0xb];
    auVar36[0xc] = cVar22 - auVar35[0xc];
    auVar36[0xd] = cVar23 - auVar35[0xd];
    auVar36[0xe] = cVar24 - auVar35[0xe];
    auVar36[0xf] = cVar25 - auVar35[0xf];
    cVar9 = pavgb(auVar10[0],auVar36[0]);
    cVar11 = pavgb(auVar10[1],auVar36[1]);
    cVar12 = pavgb(auVar10[2],auVar36[2]);
    cVar13 = pavgb(auVar10[3],auVar36[3]);
    cVar14 = pavgb(auVar10[4],auVar36[4]);
    cVar15 = pavgb(auVar10[5],auVar36[5]);
    cVar16 = pavgb(auVar10[6],auVar36[6]);
    cVar17 = pavgb(auVar10[7],auVar36[7]);
    cVar18 = pavgb(auVar10[8],auVar36[8]);
    cVar19 = pavgb(auVar10[9],auVar36[9]);
    cVar20 = pavgb(auVar10[10],auVar36[10]);
    cVar21 = pavgb(auVar10[0xb],auVar36[0xb]);
    cVar22 = pavgb(auVar10[0xc],auVar36[0xc]);
    cVar23 = pavgb(auVar10[0xd],auVar36[0xd]);
    cVar24 = pavgb(auVar10[0xe],auVar36[0xe]);
    cVar25 = pavgb(auVar10[0xf],auVar36[0xf]);
    auVar35 = (auVar36 ^ auVar10) & auVar6;
    cVar9 = (cVar9 - auVar35[0]) + *pcVar1;
    cVar11 = (cVar11 - auVar35[1]) + pcVar1[1];
    cVar12 = (cVar12 - auVar35[2]) + pcVar1[2];
    cVar13 = (cVar13 - auVar35[3]) + pcVar1[3];
    uVar48 = CONCAT13(cVar13,CONCAT12(cVar12,CONCAT11(cVar11,cVar9)));
    auVar39[4] = (cVar14 - auVar35[4]) + pcVar1[4];
    auVar39[5] = (cVar15 - auVar35[5]) + pcVar1[5];
    auVar39[6] = (cVar16 - auVar35[6]) + pcVar1[6];
    auVar39[7] = (cVar17 - auVar35[7]) + pcVar1[7];
    auVar39[8] = (cVar18 - auVar35[8]) + cVar37;
    auVar39[9] = (cVar19 - auVar35[9]) + cVar42;
    auVar39[10] = (cVar20 - auVar35[10]) + cVar43;
    auVar39[0xb] = (cVar21 - auVar35[0xb]) + cVar44;
    auVar39[0xc] = (cVar22 - auVar35[0xc]) + cVar2;
    auVar39[0xd] = (cVar23 - auVar35[0xd]) + cVar3;
    auVar39[0xe] = (cVar24 - auVar35[0xe]) + cVar4;
    auVar39[0xf] = (cVar25 - auVar35[0xf]) + cVar5;
    cVar9 = pavgb(cVar9,auVar45[4]);
    cVar11 = pavgb(cVar11,auVar45[5]);
    cVar12 = pavgb(cVar12,auVar45[6]);
    cVar13 = pavgb(cVar13,auVar45[7]);
    cVar14 = pavgb(auVar39[4],uVar26);
    cVar15 = pavgb(auVar39[5],uVar27);
    cVar16 = pavgb(auVar39[6],uVar28);
    cVar17 = pavgb(auVar39[7],uVar29);
    cVar18 = pavgb(auVar39[8],uVar30);
    cVar19 = pavgb(auVar39[9],uVar31);
    cVar20 = pavgb(auVar39[10],uVar32);
    cVar21 = pavgb(auVar39[0xb],uVar33);
    cVar22 = pavgb(auVar39[0xc],0);
    cVar23 = pavgb(auVar39[0xd],0);
    cVar24 = pavgb(auVar39[0xe],0);
    cVar25 = pavgb(auVar39[0xf],0);
    auVar35 = (auVar45 >> 0x20 ^ auVar39) & auVar6;
    auVar46[0] = cVar9 - auVar35[0];
    auVar46[1] = cVar11 - auVar35[1];
    auVar46[2] = cVar12 - auVar35[2];
    auVar46[3] = cVar13 - auVar35[3];
    auVar46[4] = cVar14 - auVar35[4];
    auVar46[5] = cVar15 - auVar35[5];
    auVar46[6] = cVar16 - auVar35[6];
    auVar46[7] = cVar17 - auVar35[7];
    auVar46[8] = cVar18 - auVar35[8];
    auVar46[9] = cVar19 - auVar35[9];
    auVar46[10] = cVar20 - auVar35[10];
    auVar46[0xb] = cVar21 - auVar35[0xb];
    auVar46[0xc] = cVar22 - auVar35[0xc];
    auVar46[0xd] = cVar23 - auVar35[0xd];
    auVar46[0xe] = cVar24 - auVar35[0xe];
    auVar46[0xf] = cVar25 - auVar35[0xf];
    cVar9 = pavgb(auVar10[4],auVar46[0]);
    cVar11 = pavgb(auVar10[5],auVar46[1]);
    cVar12 = pavgb(auVar10[6],auVar46[2]);
    cVar13 = pavgb(auVar10[7],auVar46[3]);
    cVar14 = pavgb(auVar10[8],auVar46[4]);
    cVar15 = pavgb(auVar10[9],auVar46[5]);
    cVar16 = pavgb(auVar10[10],auVar46[6]);
    cVar17 = pavgb(auVar10[0xb],auVar46[7]);
    cVar18 = pavgb(auVar10[0xc],auVar46[8]);
    cVar19 = pavgb(auVar10[0xd],auVar46[9]);
    cVar20 = pavgb(auVar10[0xe],auVar46[10]);
    cVar21 = pavgb(auVar10[0xf],auVar46[0xb]);
    cVar22 = pavgb(0,auVar46[0xc]);
    cVar23 = pavgb(0,auVar46[0xd]);
    cVar24 = pavgb(0,auVar46[0xe]);
    cVar25 = pavgb(0,auVar46[0xf]);
    auVar35 = (auVar46 ^ auVar10 >> 0x20) & auVar6;
    auVar40[0xc] = cVar22 - auVar35[0xc];
    auVar40[0xd] = cVar23 - auVar35[0xd];
    auVar40[0xe] = cVar24 - auVar35[0xe];
    auVar40[0xf] = cVar25 - auVar35[0xf];
    cVar9 = (cVar9 - auVar35[0]) + pcVar1[4];
    cVar11 = (cVar11 - auVar35[1]) + pcVar1[5];
    cVar12 = (cVar12 - auVar35[2]) + pcVar1[6];
    cVar13 = (cVar13 - auVar35[3]) + pcVar1[7];
    auVar40._0_4_ = CONCAT13(cVar13,CONCAT12(cVar12,CONCAT11(cVar11,cVar9)));
    auVar40[4] = (cVar14 - auVar35[4]) + cVar37;
    auVar40[5] = (cVar15 - auVar35[5]) + cVar42;
    auVar40[6] = (cVar16 - auVar35[6]) + cVar43;
    auVar40[7] = (cVar17 - auVar35[7]) + cVar44;
    auVar40[8] = (cVar18 - auVar35[8]) + cVar2;
    auVar40[9] = (cVar19 - auVar35[9]) + cVar3;
    auVar40[10] = (cVar20 - auVar35[10]) + cVar4;
    auVar40[0xb] = (cVar21 - auVar35[0xb]) + cVar5;
    uVar34 = CONCAT44(auVar40._0_4_,uVar48);
    cVar9 = pavgb(cVar9,uVar26);
    cVar11 = pavgb(cVar11,uVar27);
    cVar12 = pavgb(cVar12,uVar28);
    cVar13 = pavgb(cVar13,uVar29);
    cVar14 = pavgb(auVar40[4],uVar30);
    cVar15 = pavgb(auVar40[5],uVar31);
    cVar16 = pavgb(auVar40[6],uVar32);
    cVar17 = pavgb(auVar40[7],uVar33);
    cVar18 = pavgb(auVar40[8],0);
    cVar19 = pavgb(auVar40[9],0);
    cVar20 = pavgb(auVar40[10],0);
    cVar21 = pavgb(auVar40[0xb],0);
    cVar22 = pavgb(auVar40[0xc],0);
    cVar23 = pavgb(auVar40[0xd],0);
    cVar24 = pavgb(auVar40[0xe],0);
    cVar25 = pavgb(auVar40[0xf],0);
    auVar35 = (auVar45 >> 0x40 ^ auVar40) & auVar6;
    auVar47[0] = cVar9 - auVar35[0];
    auVar47[1] = cVar11 - auVar35[1];
    auVar47[2] = cVar12 - auVar35[2];
    auVar47[3] = cVar13 - auVar35[3];
    auVar47[4] = cVar14 - auVar35[4];
    auVar47[5] = cVar15 - auVar35[5];
    auVar47[6] = cVar16 - auVar35[6];
    auVar47[7] = cVar17 - auVar35[7];
    auVar47[8] = cVar18 - auVar35[8];
    auVar47[9] = cVar19 - auVar35[9];
    auVar47[10] = cVar20 - auVar35[10];
    auVar47[0xb] = cVar21 - auVar35[0xb];
    auVar47[0xc] = cVar22 - auVar35[0xc];
    auVar47[0xd] = cVar23 - auVar35[0xd];
    auVar47[0xe] = cVar24 - auVar35[0xe];
    auVar47[0xf] = cVar25 - auVar35[0xf];
    cVar9 = pavgb(auVar10[8],auVar47[0]);
    cVar11 = pavgb(auVar10[9],auVar47[1]);
    cVar12 = pavgb(auVar10[10],auVar47[2]);
    cVar13 = pavgb(auVar10[0xb],auVar47[3]);
    cVar14 = pavgb(auVar10[0xc],auVar47[4]);
    cVar15 = pavgb(auVar10[0xd],auVar47[5]);
    cVar16 = pavgb(auVar10[0xe],auVar47[6]);
    cVar17 = pavgb(auVar10[0xf],auVar47[7]);
    cVar18 = pavgb(0,auVar47[8]);
    cVar19 = pavgb(0,auVar47[9]);
    cVar20 = pavgb(0,auVar47[10]);
    cVar21 = pavgb(0,auVar47[0xb]);
    cVar22 = pavgb(0,auVar47[0xc]);
    cVar23 = pavgb(0,auVar47[0xd]);
    cVar24 = pavgb(0,auVar47[0xe]);
    cVar25 = pavgb(0,auVar47[0xf]);
    auVar35 = (auVar47 ^ auVar10 >> 0x40) & auVar6;
    auVar41[8] = cVar18 - auVar35[8];
    auVar41[9] = cVar19 - auVar35[9];
    auVar41[10] = cVar20 - auVar35[10];
    auVar41[0xb] = cVar21 - auVar35[0xb];
    auVar41[0xc] = cVar22 - auVar35[0xc];
    auVar41[0xd] = cVar23 - auVar35[0xd];
    auVar41[0xe] = cVar24 - auVar35[0xe];
    auVar41[0xf] = cVar25 - auVar35[0xf];
    cVar37 = (cVar9 - auVar35[0]) + cVar37;
    cVar42 = (cVar11 - auVar35[1]) + cVar42;
    cVar43 = (cVar12 - auVar35[2]) + cVar43;
    cVar44 = (cVar13 - auVar35[3]) + cVar44;
    uVar49 = CONCAT13(cVar44,CONCAT12(cVar43,CONCAT11(cVar42,cVar37)));
    auVar41[4] = (cVar14 - auVar35[4]) + cVar2;
    auVar41[5] = (cVar15 - auVar35[5]) + cVar3;
    auVar41[6] = (cVar16 - auVar35[6]) + cVar4;
    auVar41[7] = (cVar17 - auVar35[7]) + cVar5;
    cVar37 = pavgb(cVar37,uVar30);
    cVar42 = pavgb(cVar42,uVar31);
    cVar43 = pavgb(cVar43,uVar32);
    cVar44 = pavgb(cVar44,uVar33);
    cVar9 = pavgb(auVar41[4],0);
    cVar11 = pavgb(auVar41[5],0);
    cVar12 = pavgb(auVar41[6],0);
    cVar13 = pavgb(auVar41[7],0);
    cVar14 = pavgb(auVar41[8],0);
    cVar15 = pavgb(auVar41[9],0);
    cVar16 = pavgb(auVar41[10],0);
    cVar17 = pavgb(auVar41[0xb],0);
    cVar18 = pavgb(auVar41[0xc],0);
    cVar19 = pavgb(auVar41[0xd],0);
    cVar20 = pavgb(auVar41[0xe],0);
    cVar21 = pavgb(auVar41[0xf],0);
    auVar35 = (auVar45 >> 0x60 ^ auVar41) & auVar6;
    auVar45[0] = cVar37 - auVar35[0];
    auVar45[1] = cVar42 - auVar35[1];
    auVar45[2] = cVar43 - auVar35[2];
    auVar45[3] = cVar44 - auVar35[3];
    auVar45[4] = cVar9 - auVar35[4];
    auVar45[5] = cVar11 - auVar35[5];
    auVar45[6] = cVar12 - auVar35[6];
    auVar45[7] = cVar13 - auVar35[7];
    auVar45[8] = cVar14 - auVar35[8];
    auVar45[9] = cVar15 - auVar35[9];
    auVar45[10] = cVar16 - auVar35[10];
    auVar45[0xb] = cVar17 - auVar35[0xb];
    auVar45[0xc] = cVar18 - auVar35[0xc];
    auVar45[0xd] = cVar19 - auVar35[0xd];
    auVar45[0xe] = cVar20 - auVar35[0xe];
    auVar45[0xf] = cVar21 - auVar35[0xf];
    cVar37 = pavgb(auVar10[0xc],auVar45[0]);
    cVar42 = pavgb(auVar10[0xd],auVar45[1]);
    cVar43 = pavgb(auVar10[0xe],auVar45[2]);
    cVar44 = pavgb(auVar10[0xf],auVar45[3]);
    cVar9 = pavgb(0,auVar45[4]);
    cVar11 = pavgb(0,auVar45[5]);
    cVar12 = pavgb(0,auVar45[6]);
    cVar13 = pavgb(0,auVar45[7]);
    cVar14 = pavgb(0,auVar45[8]);
    cVar15 = pavgb(0,auVar45[9]);
    cVar16 = pavgb(0,auVar45[10]);
    cVar17 = pavgb(0,auVar45[0xb]);
    cVar18 = pavgb(0,auVar45[0xc]);
    cVar19 = pavgb(0,auVar45[0xd]);
    cVar20 = pavgb(0,auVar45[0xe]);
    cVar21 = pavgb(0,auVar45[0xf]);
    auVar45 = (auVar45 ^ auVar10 >> 0x60) & auVar6;
    auVar35[4] = cVar9 - auVar45[4];
    auVar35[5] = cVar11 - auVar45[5];
    auVar35[6] = cVar12 - auVar45[6];
    auVar35[7] = cVar13 - auVar45[7];
    auVar35[8] = cVar14 - auVar45[8];
    auVar35[9] = cVar15 - auVar45[9];
    auVar35[10] = cVar16 - auVar45[10];
    auVar35[0xb] = cVar17 - auVar45[0xb];
    auVar35[0xc] = cVar18 - auVar45[0xc];
    auVar35[0xd] = cVar19 - auVar45[0xd];
    auVar35[0xe] = cVar20 - auVar45[0xe];
    auVar35[0xf] = cVar21 - auVar45[0xf];
    auVar35._0_4_ =
         CONCAT13((cVar44 - auVar45[3]) + cVar5,
                  CONCAT12((cVar43 - auVar45[2]) + cVar4,
                           CONCAT11((cVar42 - auVar45[1]) + cVar3,(cVar37 - auVar45[0]) + cVar2)));
    uVar38 = CONCAT44(auVar35._0_4_,uVar49);
    *(undefined8 *)((long)out + lVar7) = uVar34;
    ((undefined8 *)((long)out + lVar7))[1] = uVar38;
    lVar7 = lVar7 + 0x10;
    lVar8 = lVar8 + 4;
  }
  if (num_pixels == (int)lVar8) {
    return;
  }
  (*VP8LPredictorsAdd_C[10])
            ((uint32_t *)((long)in + lVar7),(uint32_t *)((long)upper + lVar7),
             num_pixels - (int)lVar8,(uint32_t *)((long)out + lVar7));
  return;
}

Assistant:

static void PredictorAdd10_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* out) {
  int i;
  __m128i L = _mm_cvtsi32_si128(out[-1]);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TR = _mm_loadu_si128((const __m128i*)&upper[i + 1]);
    __m128i avgTTR;
    Average2_m128i(&T, &TR, &avgTTR);
    DO_PRED10(0);
    DO_PRED10_SHIFT;
    DO_PRED10(1);
    DO_PRED10_SHIFT;
    DO_PRED10(2);
    DO_PRED10_SHIFT;
    DO_PRED10(3);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[10](in + i, upper + i, num_pixels - i, out + i);
  }
}